

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::TriangleIntersection> *
pbrt::IntersectTriangle
          (optional<pbrt::TriangleIntersection> *__return_storage_ptr__,Ray *ray,Float tMax,
          Point3f *p0,Point3f *p1,Point3f *p2)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  byte bVar15;
  Vector3f *pVVar16;
  char cVar17;
  char cVar18;
  Vector3f *pVVar19;
  char cVar20;
  Vector3f *pVVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_ZMM18 [64];
  
  auVar29 = in_ZMM18._0_16_;
  fVar47 = (p0->super_Tuple3<pbrt::Point3,_float>).y;
  fVar41 = (p1->super_Tuple3<pbrt::Point3,_float>).y;
  fVar44 = (p2->super_Tuple3<pbrt::Point3,_float>).z;
  fVar48 = (p0->super_Tuple3<pbrt::Point3,_float>).z;
  fVar37 = (p2->super_Tuple3<pbrt::Point3,_float>).y;
  fVar38 = (p1->super_Tuple3<pbrt::Point3,_float>).z;
  fVar39 = (p2->super_Tuple3<pbrt::Point3,_float>).x;
  fVar3 = (p0->super_Tuple3<pbrt::Point3,_float>).x;
  fVar4 = (p1->super_Tuple3<pbrt::Point3,_float>).x;
  fVar8 = fVar44 - fVar48;
  fVar9 = fVar41 - fVar47;
  fVar10 = fVar38 - fVar48;
  fVar11 = fVar37 - fVar47;
  fVar12 = fVar39 - fVar3;
  fVar13 = fVar4 - fVar3;
  auVar23 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar9));
  auVar24 = vfmsub213ss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar11),auVar23);
  auVar23 = vfnmadd231ss_avx512f(auVar23,ZEXT416((uint)fVar8),ZEXT416((uint)fVar9));
  auVar24 = vaddss_avx512f(auVar24,auVar23);
  auVar23 = vmulss_avx512f(ZEXT416((uint)fVar12),ZEXT416((uint)fVar10));
  auVar25 = vfmsub213ss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar13),auVar23);
  auVar23 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar12),auVar23);
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)fVar13));
  auVar27 = vfmsub213ss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)fVar12),auVar26);
  auVar26 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)fVar11),auVar26);
  fVar8 = auVar25._0_4_ + auVar23._0_4_;
  auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar8 * fVar8)),auVar24,auVar24);
  auVar25 = ZEXT416((uint)(auVar27._0_4_ + auVar26._0_4_));
  auVar23 = vfmadd231ss_fma(auVar23,auVar25,auVar25);
  if ((auVar23._0_4_ == 0.0) && (!NAN(auVar23._0_4_))) goto LAB_0040bb4e;
  uVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar23._4_4_ = uVar6;
  auVar23._0_4_ = uVar5;
  auVar23._8_8_ = 0;
  auVar36._8_4_ = 0x7fffffff;
  auVar36._0_8_ = 0x7fffffff7fffffff;
  auVar36._12_4_ = 0x7fffffff;
  pVVar16 = &ray->d;
  pfVar1 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  pfVar2 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23 = vandps_avx(auVar23,auVar36);
  auVar25 = vandps_avx(ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z),auVar36);
  auVar27 = vshufps_avx(auVar23,auVar23,0xf5);
  auVar26 = vmaxss_avx(auVar23,auVar27);
  cVar17 = '\x02';
  if (auVar25._0_4_ < auVar26._0_4_) {
    cVar17 = auVar23._0_4_ <= auVar27._0_4_;
  }
  cVar20 = cVar17 + '\x01';
  if (cVar20 == '\x03') {
    cVar20 = '\0';
  }
  cVar18 = cVar20 + '\x01';
  if (cVar18 == '\x03') {
    cVar18 = '\0';
  }
  pVVar19 = pVVar16;
  if ((cVar20 != '\0') && (pVVar19 = (Vector3f *)pfVar1, cVar20 != '\x01')) {
    pVVar19 = (Vector3f *)pfVar2;
  }
  pVVar21 = pVVar16;
  if ((cVar18 != '\0') && (pVVar21 = (Vector3f *)pfVar1, cVar18 != '\x01')) {
    pVVar21 = (Vector3f *)pfVar2;
  }
  fVar8 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  fVar9 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  fVar10 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  if ((cVar17 != '\0') && (pVVar16 = (Vector3f *)pfVar1, cVar17 != '\x01')) {
    pVVar16 = (Vector3f *)pfVar2;
  }
  fVar3 = fVar3 - fVar8;
  auVar26 = ZEXT416((uint)(fVar47 - fVar9));
  auVar25 = ZEXT416((uint)(fVar48 - fVar10));
  auVar23 = ZEXT416((uint)fVar3);
  if ((cVar20 != '\0') && (auVar23 = auVar26, cVar20 != '\x01')) {
    auVar23 = auVar25;
  }
  auVar27 = ZEXT416((uint)fVar3);
  if ((cVar18 != '\0') && (auVar27 = auVar26, cVar18 != '\x01')) {
    auVar27 = auVar25;
  }
  auVar34 = ZEXT416((uint)fVar3);
  if ((cVar17 != '\0') && (auVar34 = auVar26, cVar17 != '\x01')) {
    auVar34 = auVar25;
  }
  fVar4 = fVar4 - fVar8;
  auVar42 = ZEXT416((uint)(fVar41 - fVar9));
  auVar26 = ZEXT416((uint)(fVar38 - fVar10));
  auVar25 = ZEXT416((uint)fVar4);
  if ((cVar20 != '\0') && (auVar25 = auVar42, cVar20 != '\x01')) {
    auVar25 = auVar26;
  }
  auVar40 = ZEXT416((uint)fVar4);
  if ((cVar18 != '\0') && (auVar40 = auVar42, cVar18 != '\x01')) {
    auVar40 = auVar26;
  }
  auVar33 = ZEXT416((uint)fVar4);
  if ((cVar17 != '\0') && (auVar33 = auVar42, cVar17 != '\x01')) {
    auVar33 = auVar26;
  }
  fVar39 = fVar39 - fVar8;
  auVar28 = ZEXT416((uint)(fVar37 - fVar9));
  auVar42 = ZEXT416((uint)(fVar44 - fVar10));
  auVar26 = ZEXT416((uint)fVar39);
  if ((cVar20 != '\0') && (auVar26 = auVar28, cVar20 != '\x01')) {
    auVar26 = auVar42;
  }
  auVar30 = ZEXT416((uint)fVar39);
  if ((cVar18 != '\0') && (auVar30 = auVar28, cVar18 != '\x01')) {
    auVar30 = auVar42;
  }
  fVar47 = (pVVar16->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar35 = ZEXT416((uint)fVar39);
  if ((cVar17 != '\0') && (auVar35 = auVar28, cVar17 != '\x01')) {
    auVar35 = auVar42;
  }
  auVar31._0_4_ = -(pVVar19->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar31._4_4_ = 0x80000000;
  auVar31._8_4_ = 0x80000000;
  auVar31._12_4_ = 0x80000000;
  auVar42._0_4_ = -(pVVar21->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar42._4_4_ = 0x80000000;
  auVar42._8_4_ = 0x80000000;
  auVar42._12_4_ = 0x80000000;
  auVar32._0_4_ = auVar31._0_4_ / fVar47;
  auVar32._4_12_ = auVar31._4_12_;
  auVar28._0_4_ = auVar42._0_4_ / fVar47;
  auVar28._4_12_ = auVar42._4_12_;
  auVar27 = vfmadd231ss_fma(auVar27,auVar28,auVar34);
  auVar25 = vfmadd231ss_fma(auVar25,auVar32,auVar33);
  auVar23 = vfmadd231ss_fma(auVar23,auVar32,auVar34);
  auVar42 = vfmadd231ss_fma(auVar40,auVar28,auVar33);
  auVar40 = vfmadd231ss_fma(auVar30,auVar35,auVar28);
  auVar26 = vfmadd231ss_fma(auVar26,auVar35,auVar32);
  auVar30 = ZEXT416((uint)(auVar27._0_4_ * auVar25._0_4_));
  auVar28 = vfmsub213ss_fma(auVar42,auVar23,auVar30);
  auVar30 = vfnmadd231ss_fma(auVar30,auVar27,auVar25);
  fVar41 = auVar28._0_4_ + auVar30._0_4_;
  auVar30 = ZEXT416((uint)fVar41);
  if ((fVar41 != 0.0) || (NAN(fVar41))) {
    auVar31 = ZEXT416((uint)(auVar42._0_4_ * auVar26._0_4_));
    auVar28 = vfmsub213ss_fma(auVar40,auVar25,auVar31);
    auVar31 = vfnmadd231ss_fma(auVar31,auVar42,auVar26);
    fVar41 = auVar28._0_4_ + auVar31._0_4_;
    auVar46 = ZEXT416((uint)fVar41);
    if ((fVar41 == 0.0) && (!NAN(fVar41))) goto LAB_0040ba9d;
    auVar31 = ZEXT416((uint)(auVar40._0_4_ * auVar23._0_4_));
    auVar28 = vfmsub213ss_fma(auVar27,auVar26,auVar31);
    auVar31 = vfnmadd231ss_fma(auVar31,auVar40,auVar23);
    fVar41 = auVar28._0_4_ + auVar31._0_4_;
    auVar50 = ZEXT416((uint)fVar41);
    if ((fVar41 == 0.0) && (!NAN(fVar41))) goto LAB_0040ba9d;
  }
  else {
LAB_0040ba9d:
    auVar43._0_8_ = (double)auVar26._0_4_;
    auVar43._8_8_ = auVar26._8_8_;
    auVar51._0_8_ = (double)auVar42._0_4_;
    auVar51._8_8_ = auVar42._8_8_;
    auVar49._0_8_ = (double)auVar40._0_4_;
    auVar49._8_8_ = auVar40._8_8_;
    auVar24 = vcvtss2sd_avx512f(auVar25,auVar25);
    auVar28 = vcvtss2sd_avx512f(auVar23,auVar23);
    auVar29 = vcvtss2sd_avx512f(auVar27,auVar27);
    auVar30 = vmulsd_avx512f(auVar24,auVar49);
    auVar31 = vmulsd_avx512f(auVar28,auVar49);
    auVar32 = vmulsd_avx512f(auVar29,auVar43);
    auVar28 = vmulsd_avx512f(auVar28,auVar51);
    dVar7 = auVar32._0_8_ - auVar31._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auVar51._0_8_ * auVar43._0_8_;
    auVar30 = vsubsd_avx512f(auVar30,auVar45);
    auVar50._0_4_ = (float)dVar7;
    auVar50._4_4_ = (int)((ulong)dVar7 >> 0x20);
    auVar50._8_8_ = 0;
    auVar31 = vmulsd_avx512f(auVar29,auVar24);
    auVar46._0_4_ = (float)auVar30._0_8_;
    auVar46._4_12_ = auVar30._4_12_;
    dVar7 = auVar28._0_8_ - auVar31._0_8_;
    auVar30._0_4_ = (float)dVar7;
    auVar30._4_4_ = (int)((ulong)dVar7 >> 0x20);
    auVar30._8_8_ = 0;
  }
  fVar44 = auVar46._0_4_;
  fVar48 = auVar50._0_4_;
  fVar41 = auVar30._0_4_;
  if ((fVar44 < 0.0) || (bVar22 = 0.0 < fVar48, fVar48 < 0.0)) {
LAB_0040bb1f:
    if (((0.0 < fVar44) || (0.0 < fVar48)) || (bVar22 = fVar41 < 0.0, fVar37 = fVar41, 0.0 < fVar41)
       ) goto LAB_0040bb4e;
  }
  else {
    vxorps_avx512vl(auVar24,auVar24);
    vucomiss_avx512f(auVar30);
    fVar37 = fVar48;
    if (fVar48 < 0.0) goto LAB_0040bb1f;
  }
  auVar24 = vxorps_avx512vl(auVar29,auVar29);
  auVar24 = vucomiss_avx512f(auVar24);
  if ((fVar37 != 0.0) || (NAN(fVar37))) {
    vucomiss_avx512f(auVar24);
    auVar29 = vdivss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar47));
    auVar33 = vmulss_avx512f(auVar29,auVar33);
    auVar28 = vmulss_avx512f(auVar29,auVar35);
    auVar34 = vmulss_avx512f(auVar29,auVar34);
    auVar29 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar33._0_4_ * fVar48)),auVar46,auVar34);
    auVar29 = vfmadd231ss_fma(auVar29,auVar30,auVar28);
    fVar38 = auVar24._0_4_;
    fVar47 = auVar29._0_4_;
    if (((bVar22 || fVar37 == 0.0) || ((fVar47 < 0.0 && (fVar38 * tMax <= fVar47)))) &&
       ((fVar38 <= 0.0 || ((0.0 < fVar47 && (fVar47 <= fVar38 * tMax)))))) {
      auVar35 = vdivss_avx512f(ZEXT416(0x3f800000),auVar24);
      auVar24 = vinsertps_avx(auVar46,auVar27,0x10);
      auVar27 = vinsertps_avx(auVar50,auVar42,0x10);
      auVar34 = vinsertps_avx512f(auVar23,auVar34,0x10);
      auVar29 = vinsertps_avx(auVar25,auVar33,0x10);
      auVar23 = vandps_avx(auVar24,auVar36);
      auVar24 = vandps_avx(auVar27,auVar36);
      auVar25 = vandps_avx(auVar34,auVar36);
      auVar27 = vandps_avx(auVar29,auVar36);
      auVar29 = vmaxps_avx(auVar24,auVar23);
      auVar23 = vinsertps_avx(auVar30,auVar40,0x10);
      auVar25 = vmaxps_avx(auVar27,auVar25);
      auVar24 = vinsertps_avx(auVar26,auVar28,0x10);
      auVar23 = vandps_avx(auVar23,auVar36);
      auVar24 = vandps_avx(auVar24,auVar36);
      uVar14 = vcmpps_avx512vl(auVar29,auVar23,1);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar25 = vmovshdup_avx(auVar29);
      auVar27 = vshufps_avx512vl(auVar23,auVar23,0xf5);
      fVar37 = auVar24._0_4_;
      bVar15 = (byte)(uVar14 >> 1);
      auVar26 = vmovshdup_avx(auVar24);
      fVar39 = auVar26._0_4_;
      fVar38 = auVar35._0_4_;
      auVar24 = vandps_avx(auVar35,auVar36);
      auVar25._0_4_ = (uint)(bVar15 & 1) * auVar27._0_4_ + (uint)!(bool)(bVar15 & 1) * auVar25._0_4_
      ;
      auVar27._4_12_ = auVar29._4_12_;
      auVar27._0_4_ =
           (float)((uint)((byte)uVar14 & 1) * auVar23._0_4_ +
                  (uint)!(bool)((byte)uVar14 & 1) * auVar29._0_4_);
      auVar23 = vaddss_avx512f(auVar25,auVar26);
      auVar23 = vmulss_avx512f(auVar23,SUB6416(ZEXT464(0x34a00003),0));
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * fVar37)),auVar25,
                                ZEXT416((uint)(fVar37 * 1.192093e-07)));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)((fVar37 + fVar39) * 2.980233e-07)),auVar25);
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * (auVar23._0_4_ + auVar23._0_4_))),auVar26,
                                ZEXT416((uint)(auVar27._0_4_ * 1.7881396e-07)));
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)(fVar39 * 1.7881396e-07)),auVar27);
      if (auVar24._0_4_ * auVar23._0_4_ * 3.0 < fVar47 * fVar38) {
        __return_storage_ptr__->set = true;
        *(float *)&__return_storage_ptr__->optionalValue = fVar44 * fVar38;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 4) = fVar48 * fVar38;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 8) = fVar41 * fVar38;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar47 * fVar38;
        return __return_storage_ptr__;
      }
    }
  }
LAB_0040bb4e:
  *(undefined4 *)&__return_storage_ptr__->set = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<TriangleIntersection> IntersectTriangle(const Ray &ray, Float tMax,
                                                       const Point3f &p0,
                                                       const Point3f &p1,
                                                       const Point3f &p2) {
    // Return no intersection if triangle is degenerate
    if (LengthSquared(Cross(p2 - p0, p1 - p0)) == 0)
        return {};

    // Transform triangle vertices to ray coordinate space
    // Translate vertices based on ray origin
    Point3f p0t = p0 - Vector3f(ray.o);
    Point3f p1t = p1 - Vector3f(ray.o);
    Point3f p2t = p2 - Vector3f(ray.o);

    // Permute components of triangle vertices and ray direction
    int kz = MaxComponentIndex(Abs(ray.d));
    int kx = kz + 1;
    if (kx == 3)
        kx = 0;
    int ky = kx + 1;
    if (ky == 3)
        ky = 0;
    Vector3f d = Permute(ray.d, {kx, ky, kz});
    p0t = Permute(p0t, {kx, ky, kz});
    p1t = Permute(p1t, {kx, ky, kz});
    p2t = Permute(p2t, {kx, ky, kz});

    // Apply shear transformation to translated vertex positions
    Float Sx = -d.x / d.z;
    Float Sy = -d.y / d.z;
    Float Sz = 1.f / d.z;
    p0t.x += Sx * p0t.z;
    p0t.y += Sy * p0t.z;
    p1t.x += Sx * p1t.z;
    p1t.y += Sy * p1t.z;
    p2t.x += Sx * p2t.z;
    p2t.y += Sy * p2t.z;

    // Compute edge function coefficients _e0_, _e1_, and _e2_
    Float e0 = DifferenceOfProducts(p1t.x, p2t.y, p1t.y, p2t.x);
    Float e1 = DifferenceOfProducts(p2t.x, p0t.y, p2t.y, p0t.x);
    Float e2 = DifferenceOfProducts(p0t.x, p1t.y, p0t.y, p1t.x);

    // Fall back to double precision test at triangle edges
    if (sizeof(Float) == sizeof(float) && (e0 == 0.0f || e1 == 0.0f || e2 == 0.0f)) {
        double p2txp1ty = (double)p2t.x * (double)p1t.y;
        double p2typ1tx = (double)p2t.y * (double)p1t.x;
        e0 = (float)(p2typ1tx - p2txp1ty);
        double p0txp2ty = (double)p0t.x * (double)p2t.y;
        double p0typ2tx = (double)p0t.y * (double)p2t.x;
        e1 = (float)(p0typ2tx - p0txp2ty);
        double p1txp0ty = (double)p1t.x * (double)p0t.y;
        double p1typ0tx = (double)p1t.y * (double)p0t.x;
        e2 = (float)(p1typ0tx - p1txp0ty);
    }

    // Perform triangle edge and determinant tests
    if ((e0 < 0 || e1 < 0 || e2 < 0) && (e0 > 0 || e1 > 0 || e2 > 0))
        return {};
    Float det = e0 + e1 + e2;
    if (det == 0)
        return {};

    // Compute scaled hit distance to triangle and test against ray $t$ range
    p0t.z *= Sz;
    p1t.z *= Sz;
    p2t.z *= Sz;
    Float tScaled = e0 * p0t.z + e1 * p1t.z + e2 * p2t.z;
    if (det < 0 && (tScaled >= 0 || tScaled < tMax * det))
        return {};
    else if (det > 0 && (tScaled <= 0 || tScaled > tMax * det))
        return {};

    // Compute barycentric coordinates and $t$ value for triangle intersection
    Float invDet = 1 / det;
    Float b0 = e0 * invDet, b1 = e1 * invDet, b2 = e2 * invDet;
    Float t = tScaled * invDet;
    DCHECK(!IsNaN(t));

    // Ensure that computed triangle $t$ is conservatively greater than zero
    // Compute $\delta_z$ term for triangle $t$ error bounds
    Float maxZt = MaxComponentValue(Abs(Vector3f(p0t.z, p1t.z, p2t.z)));
    Float deltaZ = gamma(3) * maxZt;

    // Compute $\delta_x$ and $\delta_y$ terms for triangle $t$ error bounds
    Float maxXt = MaxComponentValue(Abs(Vector3f(p0t.x, p1t.x, p2t.x)));
    Float maxYt = MaxComponentValue(Abs(Vector3f(p0t.y, p1t.y, p2t.y)));
    Float deltaX = gamma(5) * (maxXt + maxZt);
    Float deltaY = gamma(5) * (maxYt + maxZt);

    // Compute $\delta_e$ term for triangle $t$ error bounds
    Float deltaE = 2 * (gamma(2) * maxXt * maxYt + deltaY * maxXt + deltaX * maxYt);

    // Compute $\delta_t$ term for triangle $t$ error bounds and check _t_
    Float maxE = MaxComponentValue(Abs(Vector3f(e0, e1, e2)));
    Float deltaT =
        3 * (gamma(3) * maxE * maxZt + deltaE * maxZt + deltaZ * maxE) * std::abs(invDet);
    if (t <= deltaT)
        return {};

    // Return _TriangleIntersection_ for intersection
    return TriangleIntersection{b0, b1, b2, t};
}